

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week6-app3.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  array<int,_5UL> *__range1;
  int iVar4;
  int iVar5;
  int cnt;
  int iVar6;
  int iVar7;
  array<int,_5UL> a;
  int local_48 [8];
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_48[4] = 5;
  lVar1 = 0;
  do {
    *(int *)((long)local_48 + lVar1) = *(int *)((long)local_48 + lVar1) + 1;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x14);
  iVar6 = 0;
  lVar1 = 0;
  do {
    iVar6 = iVar6 + (uint)(1 < *(int *)((long)local_48 + lVar1));
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count=",6);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  iVar7 = 10;
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  iVar6 = 0;
  iVar4 = 1;
  do {
    iVar5 = iVar6 + iVar4;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    iVar7 = iVar7 + -1;
    iVar6 = iVar4;
    iVar4 = iVar5;
  } while (iVar7 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto a = array<int, 5>{1, 2, 3, 4, 5};
    transform(a, [](int& a) { ++a; }); // a is now {2, 3, 4, 5, 6}

//    auto greater_than_3 = GreaterThan3();
//    auto greater_than_3 = [](int value) { return value > 3; };
    auto greater_than_1 = [](int value) { return value > 1; };

    auto cnt = count_if(a, greater_than_1);
    cout << "Count=" << cnt << endl;

    auto fg = FiboGenerator();
    for(int i=0; i<10; ++i)
        cout << fg() << " ";
    cout << endl;

    return 0;
}